

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhysicalDevice.cpp
# Opt level: O0

bool __thiscall
myvk::PhysicalDevice::GetExtensionSupport
          (PhysicalDevice *this,string *extension_name,uint32_t *p_version)

{
  bool bVar1;
  pointer ppVar2;
  uint *in_RDX;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_stack_ffffffffffffffb8;
  byte local_31;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  uint *local_18;
  
  local_18 = in_RDX;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x2c160e);
  local_31 = 0;
  if (local_18 != (uint *)0x0) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator==(&local_20,&local_28);
    local_31 = bVar1 ^ 0xff;
  }
  if ((local_31 & 1) != 0) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                           *)0x2c1660);
    *local_18 = ppVar2->second;
  }
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::operator==(&local_20,&local_30);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool PhysicalDevice::GetExtensionSupport(const std::string &extension_name, uint32_t *p_version) const {
	auto it = m_extensions.find(extension_name);
	if (p_version && it != m_extensions.end())
		*p_version = it->second;
	return it != m_extensions.end();
}